

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O2

void NGA_Nblock(int g_a,int *nblock)

{
  Integer IVar1;
  int *piVar2;
  long lVar3;
  long lVar4;
  Integer _ga_work [7];
  Integer local_48 [7];
  
  pnga_nblock((long)g_a,local_48);
  IVar1 = pnga_get_dimension((long)g_a);
  lVar3 = 0;
  lVar4 = 0;
  if (0 < IVar1) {
    lVar4 = IVar1;
  }
  piVar2 = nblock + IVar1;
  for (; piVar2 = piVar2 + -1, lVar4 != lVar3; lVar3 = lVar3 + 1) {
    *piVar2 = (int)local_48[lVar3];
  }
  return;
}

Assistant:

void NGA_Nblock(int g_a, int *nblock)
{
    Integer aa, ndim;
    Integer _ga_work[MAXDIM];
    aa = (Integer)g_a;
    wnga_nblock(aa, _ga_work);
    ndim = wnga_get_dimension(aa);
    COPYF2C(_ga_work,nblock,ndim);
}